

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  ushort uVar1;
  sqlite3 *db;
  Mem *pMVar2;
  sqlite3 **ppsVar3;
  int iVar4;
  
  db = p->db;
  uVar1 = p->nResColumn;
  if (uVar1 != 0) {
    releaseMemArray(p->aColName,(uint)uVar1 + (uint)uVar1 * 4);
    if (p->aColName != (Mem *)0x0) {
      sqlite3DbFreeNN(db,p->aColName);
    }
  }
  p->nResColumn = (u16)nResColumn;
  pMVar2 = (Mem *)sqlite3DbMallocRawNN(db,(long)(nResColumn * 5) * 0x38);
  p->aColName = pMVar2;
  if (0 < nResColumn && pMVar2 != (Mem *)0x0) {
    ppsVar3 = &pMVar2->db;
    iVar4 = nResColumn * 5 + 1;
    do {
      *ppsVar3 = db;
      *(u16 *)(ppsVar3 + -4) = 1;
      *(int *)(ppsVar3 + -1) = 0;
      ppsVar3 = ppsVar3 + 7;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResColumn ){
    releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}